

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

int qtree_encode(char *outfile,int *a,int n,int nqx,int nqy,int nbitplanes)

{
  char *outfile_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *buffer;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  int b;
  uint local_90;
  uint local_84;
  ulong local_80;
  int local_78;
  int local_74;
  int *local_70;
  ulong local_68;
  char *local_60;
  int local_54;
  int local_50;
  int local_4c;
  uchar *local_48;
  uchar *local_40;
  ulong local_38;
  
  uVar6 = (ulong)(uint)nqy;
  iVar5 = nqy;
  if (nqy < nqx) {
    iVar5 = nqx;
  }
  local_78 = n;
  local_60 = outfile;
  dVar12 = log((double)iVar5);
  iVar9 = (int)(dVar12 / 0.6931471805599453 + 0.5);
  local_80 = CONCAT71(local_80._1_7_,1 << ((byte)iVar9 & 0x1f) < iVar5);
  iVar5 = ((nqy - (nqy + 1 >> 0x1f)) + 1 >> 1) * ((nqx - (nqx + 1 >> 0x1f)) + 1 >> 1);
  uVar1 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1;
  iVar5 = (int)uVar1 >> 1;
  local_38 = (ulong)(uint)nqx;
  puVar4 = (uchar *)malloc((long)(int)(uVar1 & 0xfffffffe));
  local_74 = iVar5;
  buffer = (uchar *)malloc((long)iVar5);
  if (buffer == (uchar *)0x0 || puVar4 == (uchar *)0x0) {
    ffpmsg("qtree_encode: insufficient memory");
    iVar5 = 0x19d;
  }
  else {
    local_40 = puVar4;
    if (0 < nbitplanes) {
      iVar5 = nqx + 1 >> 1;
      iVar7 = nqy + 1 >> 1;
      local_4c = iVar7 * iVar5;
      local_50 = (uint)(byte)local_80 + iVar9;
      local_54 = iVar9 + (uint)(byte)local_80 + -1;
      local_90 = nbitplanes;
      local_70 = a;
      local_68 = uVar6;
      local_48 = buffer;
      do {
        puVar4 = local_40;
        iVar9 = local_78;
        local_80 = (ulong)local_90;
        local_90 = local_90 - 1;
        local_84 = 0;
        bitbuffer = 0;
        bits_to_go3 = 0;
        iVar8 = (int)local_38;
        qtree_onebit(a,local_78,iVar8,(int)uVar6,local_40,local_90);
        iVar2 = bufcopy(puVar4,local_4c,buffer,(int *)&local_84,local_74);
        buffer = local_48;
        a = local_70;
        if (iVar2 == 0) {
          iVar9 = local_54;
          iVar2 = iVar7;
          iVar8 = iVar5;
          if (1 < local_50) {
            do {
              qtree_reduce(puVar4,iVar2,iVar8,iVar2,puVar4);
              iVar8 = iVar8 + 1 >> 1;
              iVar2 = iVar2 + 1 >> 1;
              iVar3 = bufcopy(puVar4,iVar2 * iVar8,buffer,(int *)&local_84,local_74);
              uVar6 = local_68;
              a = local_70;
              if (iVar3 != 0) {
                write_bdirect(local_60,local_70,local_78,(int)local_38,(int)local_68,puVar4,local_90
                             );
                goto LAB_001770b6;
              }
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          outfile_00 = local_60;
          output_nybble(local_60,0xf);
          uVar6 = local_68;
          a = local_70;
          uVar1 = local_84;
          uVar10 = (ulong)local_84;
          iVar9 = (int)local_80;
          if (uVar10 == 0) {
            if (bits_to_go3 < 1) {
              uVar1 = 0x3e;
              iVar2 = 6;
            }
            else {
              uVar1 = ~(-1 << ((byte)bits_to_go3 & 0x1f)) & bitbuffer;
              iVar2 = bits_to_go3;
            }
            output_nbits(outfile_00,uVar1,iVar2);
          }
          else {
            if (0 < bits_to_go3) {
              output_nbits(outfile_00,~(-1 << ((byte)bits_to_go3 & 0x1f)) & bitbuffer,bits_to_go3);
            }
            if (0 < (int)uVar1) {
              lVar11 = uVar10 + 1;
              do {
                output_nbits(outfile_00,(uint)buffer[lVar11 + -2],8);
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
            }
          }
        }
        else {
          write_bdirect(local_60,local_70,iVar9,iVar8,(int)uVar6,puVar4,local_90);
          buffer = local_48;
LAB_001770b6:
          iVar9 = (int)local_80;
        }
      } while (1 < iVar9);
    }
    free(buffer);
    free(local_40);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
qtree_encode(char *outfile, int a[], int n, int nqx, int nqy, int nbitplanes)
{

/*
int a[];
int n;								 physical dimension of row in a		
int nqx;							 length of row			
int nqy;							 length of column (<=n)				
int nbitplanes;						 number of bit planes to output	
*/
	
int log2n, i, k, bit, b, bmax, nqmax, nqx2, nqy2, nx, ny;
unsigned char *scratch, *buffer;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * initialize buffer point, max buffer size
	 */
	nqx2 = (nqx+1)/2;
	nqy2 = (nqy+1)/2;
	bmax = (nqx2*nqy2+1)/2;
	/*
	 * We're indexing A as a 2-D array with dimensions (nqx,nqy).
	 * Scratch is 2-D with dimensions (nqx/2,nqy/2) rounded up.
	 * Buffer is used to store string of codes for output.
	 */
	scratch = (unsigned char *) malloc(2*bmax);
	buffer = (unsigned char *) malloc(bmax);
	if ((scratch == (unsigned char *) NULL) ||
		(buffer  == (unsigned char *) NULL)) {		
		ffpmsg("qtree_encode: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * now encode each bit plane, starting with the top
	 */
	for (bit=nbitplanes-1; bit >= 0; bit--) {
		/*
		 * initial bit buffer
		 */
		b = 0;
		bitbuffer = 0;
		bits_to_go3 = 0;
		/*
		 * on first pass copy A to scratch array
		 */
		qtree_onebit(a,n,nqx,nqy,scratch,bit);
		nx = (nqx+1)>>1;
		ny = (nqy+1)>>1;
		/*
		 * copy non-zero values to output buffer, which will be written
		 * in reverse order
		 */
		if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
			/*
			 * quadtree is expanding data,
			 * change warning code and just fill buffer with bit-map
			 */
			write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
			goto bitplane_done;
		}
		/*
		 * do log2n reductions
		 */
		for (k = 1; k<log2n; k++) {
			qtree_reduce(scratch,ny,nx,ny,scratch);
			nx = (nx+1)>>1;
			ny = (ny+1)>>1;
			if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
				write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
				goto bitplane_done;
			}
		}
		/*
		 * OK, we've got the code in buffer
		 * Write quadtree warning code, then write buffer in reverse order
		 */
		output_nybble(outfile,0xF);
		if (b==0) {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			} else {
				/*
				 * have to write a zero nybble if there are no 1's in array
				 */
				output_huffman(outfile,0);
			}
		} else {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			}
			for (i=b-1; i>=0; i--) {
				output_nbits(outfile,buffer[i],8);
			}
		}
		bitplane_done: ;
	}
	free(buffer);
	free(scratch);
	return(0);
}